

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

int Abc_ObjFinGateType(Abc_Obj_t *pNode)

{
  char *__s1;
  int iVar1;
  
  __s1 = *(char **)&(pNode->field_5).iData;
  iVar1 = strcmp(__s1,"1 1\n");
  if (iVar1 == 0) {
    iVar1 = -0x59;
  }
  else {
    iVar1 = strcmp(__s1,"0 1\n");
    if (iVar1 == 0) {
      iVar1 = -0x5a;
    }
    else {
      iVar1 = strcmp(__s1,"11 1\n");
      if (iVar1 == 0) {
        iVar1 = -0x60;
      }
      else {
        iVar1 = strcmp(__s1,"11 0\n");
        if (iVar1 == 0) {
          iVar1 = -0x5f;
        }
        else {
          iVar1 = strcmp(__s1,"00 0\n");
          if (iVar1 == 0) {
            iVar1 = -0x5e;
          }
          else {
            iVar1 = strcmp(__s1,"00 1\n");
            if (iVar1 == 0) {
              iVar1 = -0x5d;
            }
            else {
              iVar1 = strcmp(__s1,"01 1\n10 1\n");
              if (iVar1 == 0) {
                iVar1 = -0x5c;
              }
              else {
                iVar1 = strcmp(__s1,"11 1\n00 1\n");
                iVar1 = (uint)(iVar1 == 0) * 9 + -100;
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static inline int Abc_ObjFinGateType( Abc_Obj_t * pNode )
{
    char * pSop = (char *)pNode->pData;
    if ( !strcmp(pSop, "1 1\n") )         return ABC_FIN_RDOB_BUFF;
    if ( !strcmp(pSop, "0 1\n") )         return ABC_FIN_RDOB_NOT;
    if ( !strcmp(pSop, "11 1\n") )        return ABC_FIN_RDOB_AND;
    if ( !strcmp(pSop, "11 0\n") )        return ABC_FIN_RDOB_NAND;
    if ( !strcmp(pSop, "00 0\n") )        return ABC_FIN_RDOB_OR;
    if ( !strcmp(pSop, "00 1\n") )        return ABC_FIN_RDOB_NOR;
    if ( !strcmp(pSop, "01 1\n10 1\n") )  return ABC_FIN_RDOB_XOR;
    if ( !strcmp(pSop, "11 1\n00 1\n") )  return ABC_FIN_RDOB_NXOR;
    return ABC_FIN_NONE;
}